

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.h
# Opt level: O2

void __thiscall mkvmuxer::MasteringMetadata::~MasteringMetadata(MasteringMetadata *this)

{
  operator_delete(this->r_);
  operator_delete(this->g_);
  operator_delete(this->b_);
  operator_delete(this->white_point_);
  return;
}

Assistant:

~MasteringMetadata() {
    delete r_;
    delete g_;
    delete b_;
    delete white_point_;
  }